

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O3

void __thiscall trng::yarn2::jump2(yarn2 *this,uint s)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_38 [4];
  result_type c [4];
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_48 = *(undefined8 *)(this->P).a;
  local_40 = 1;
  if (s == 0) {
    iVar10 = (this->S).r[0];
    iVar11 = (this->S).r[1];
  }
  else {
    uVar8 = 0;
    do {
      uVar12 = 0;
      bVar2 = true;
      do {
        bVar9 = bVar2;
        uVar14 = 0;
        bVar2 = true;
        do {
          bVar6 = bVar2;
          uVar3 = 0;
          lVar13 = 0;
          bVar2 = true;
          do {
            bVar7 = bVar2;
            lVar5 = ((long)*(int *)((long)&local_48 + (uVar3 * 2 + uVar12) * 4) *
                    (long)*(int *)((long)&local_48 + (uVar3 | uVar14) * 4)) % 0x7fffffff;
            lVar1 = lVar5 + lVar13;
            lVar13 = lVar13 + -0x7fffffff + lVar5;
            if (lVar1 < 0x7fffffff) {
              lVar13 = lVar1;
            }
            uVar3 = 1;
            bVar2 = false;
          } while (bVar7);
          local_38[uVar14 | uVar12] = (int)lVar13;
          uVar14 = 2;
          bVar2 = false;
        } while (bVar6);
        uVar12 = 1;
        bVar2 = false;
      } while (bVar9);
      if (s <= (uVar8 | 1)) break;
      uVar12 = 0;
      bVar2 = true;
      do {
        bVar9 = bVar2;
        uVar14 = 0;
        bVar2 = true;
        do {
          bVar6 = bVar2;
          uVar3 = 0;
          lVar13 = 0;
          bVar2 = true;
          do {
            bVar7 = bVar2;
            lVar5 = ((long)local_38[uVar3 * 2 + uVar12] * (long)local_38[uVar3 | uVar14]) %
                    0x7fffffff;
            lVar1 = lVar5 + lVar13;
            lVar13 = lVar13 + -0x7fffffff + lVar5;
            if (lVar1 < 0x7fffffff) {
              lVar13 = lVar1;
            }
            uVar3 = 1;
            bVar2 = false;
          } while (bVar7);
          *(int *)((long)&local_48 + (uVar14 | uVar12) * 4) = (int)lVar13;
          uVar14 = 2;
          bVar2 = false;
        } while (bVar6);
        uVar12 = 1;
        bVar2 = false;
      } while (bVar9);
      uVar8 = uVar8 + 2;
    } while (uVar8 < s);
    iVar10 = (this->S).r[0];
    iVar11 = (this->S).r[1];
    if ((s & 1) != 0) {
      uVar12 = 0;
      piVar15 = &local_4c;
      bVar2 = true;
      do {
        bVar9 = bVar2;
        uVar14 = 0;
        lVar13 = 0;
        iVar4 = iVar10;
        bVar2 = true;
        do {
          bVar6 = bVar2;
          lVar5 = ((long)iVar4 * (long)local_38[uVar14 | uVar12]) % 0x7fffffff;
          lVar1 = lVar5 + lVar13;
          lVar13 = lVar13 + -0x7fffffff + lVar5;
          if (lVar1 < 0x7fffffff) {
            lVar13 = lVar1;
          }
          uVar14 = 1;
          iVar4 = iVar11;
          bVar2 = false;
        } while (bVar6);
        *piVar15 = (int)lVar13;
        uVar12 = 2;
        piVar15 = &local_50;
        bVar2 = false;
      } while (bVar9);
      goto LAB_00112549;
    }
  }
  uVar12 = 0;
  piVar15 = &local_4c;
  bVar2 = true;
  do {
    bVar9 = bVar2;
    uVar14 = 0;
    lVar13 = 0;
    bVar2 = true;
    iVar4 = iVar10;
    do {
      bVar6 = bVar2;
      lVar5 = ((long)iVar4 * (long)*(int *)((long)&local_48 + (uVar14 | uVar12) * 4)) % 0x7fffffff;
      lVar1 = lVar5 + lVar13;
      lVar13 = lVar13 + -0x7fffffff + lVar5;
      if (lVar1 < 0x7fffffff) {
        lVar13 = lVar1;
      }
      uVar14 = 1;
      bVar2 = false;
      iVar4 = iVar11;
    } while (bVar6);
    *piVar15 = (int)lVar13;
    uVar12 = 2;
    piVar15 = &local_50;
    bVar2 = false;
  } while (bVar9);
LAB_00112549:
  (this->S).r[0] = local_4c;
  (this->S).r[1] = local_50;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn2::jump2(unsigned int s) {
    result_type b[4], c[4]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = 1;
    b[3] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<2>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<2>(c, c, b, modulus);
    }
    const result_type r[2]{S.r[0], S.r[1]};
    result_type d[2];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<2>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<2>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
  }